

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O0

void __thiscall sai::VirtualFileEntry::Seek(VirtualFileEntry *this,size_t NewOffset)

{
  bool bVar1;
  reference pvVar2;
  VirtualPage local_103c;
  uint local_3c;
  ulong uStack_38;
  uint32_t NextPageIndex;
  size_t i;
  undefined1 local_28 [8];
  shared_ptr<sai::ifstream> Stream;
  size_t NewOffset_local;
  VirtualFileEntry *this_local;
  
  Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)NewOffset;
  std::weak_ptr<sai::ifstream>::lock((weak_ptr<sai::ifstream> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(this->FATData).Size <=
        Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      i._4_4_ = 1;
      goto LAB_0010d18c;
    }
    this->Offset = (size_t)Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
    this->PageOffset =
         (ulong)Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi & 0xfff;
    this->PageIndex = (ulong)(this->FATData).PageIndex;
    for (uStack_38 = 0;
        uStack_38 <
        (ulong)Stream.super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi >> 0xc; uStack_38 = uStack_38 + 1) {
      GetTablePage(&local_103c,this,this->PageIndex);
      pvVar2 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                         (&local_103c.PageEntries,this->PageIndex & 0x1ff);
      local_3c = pvVar2->NextPageIndex;
      if (local_3c == 0) break;
      this->PageIndex = (ulong)local_3c;
    }
  }
  i._4_4_ = 0;
LAB_0010d18c:
  std::shared_ptr<sai::ifstream>::~shared_ptr((shared_ptr<sai::ifstream> *)local_28);
  return;
}

Assistant:

void VirtualFileEntry::Seek(std::size_t NewOffset)
{
	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		if( NewOffset >= FATData.Size )
		{
			// Invalid offset
			return;
		}
		Offset     = NewOffset;
		PageOffset = NewOffset % VirtualPage::PageSize;
		PageIndex  = FATData.PageIndex;
		for( std::size_t i = 0; i < NewOffset / VirtualPage::PageSize; ++i )
		{
			// Get the next page index in the page-chain
			const std::uint32_t NextPageIndex = GetTablePage(PageIndex)
													.PageEntries[PageIndex % VirtualPage::TableSpan]
													.NextPageIndex;
			if( NextPageIndex )
			{
				PageIndex = NextPageIndex;
			}
			else
			{
				break;
			}
		}
	}
}